

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.cpp
# Opt level: O0

void run_test(string *expression,string *expected_value)

{
  bool bVar1;
  uint uVar2;
  ostream *poVar3;
  element_type *peVar4;
  string local_388 [32];
  string local_368 [32];
  undefined1 local_348 [8];
  shared_ptr<SchemeObject> actual_result;
  shared_ptr<SchemeObject> expected_result;
  istringstream local_318 [8];
  istringstream in2;
  istringstream local_198 [8];
  istringstream in1;
  string *expected_value_local;
  string *expression_local;
  
  run_test::test_num = run_test::test_num + 1;
  poVar3 = std::operator<<((ostream *)&std::cout,"Test ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,run_test::test_num);
  std::operator<<(poVar3,": ");
  init_scheme();
  std::__cxx11::istringstream::istringstream(local_198);
  std::__cxx11::istringstream::istringstream(local_318);
  evaluate_string_in_global_context
            ((string *)
             &actual_result.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  evaluate_string_in_global_context((string *)local_348);
  bVar1 = std::operator!=((shared_ptr<SchemeObject> *)
                          &actual_result.
                           super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                          (shared_ptr<SchemeObject> *)local_348);
  if (bVar1) {
    peVar4 = std::__shared_ptr_access<SchemeObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<SchemeObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&actual_result.
                            super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                       );
    uVar2 = (*peVar4->_vptr_SchemeObject[6])(peVar4,local_348);
    if ((uVar2 & 1) == 0) {
      poVar3 = std::operator<<((ostream *)&std::cout,"FAILED\n");
      poVar3 = std::operator<<(poVar3,(string *)expression);
      poVar3 = std::operator<<(poVar3," != ");
      poVar3 = std::operator<<(poVar3,(string *)expected_value);
      poVar3 = std::operator<<(poVar3," [[ ");
      peVar4 = std::__shared_ptr_access<SchemeObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<SchemeObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_348);
      (*peVar4->_vptr_SchemeObject[2])(local_368);
      poVar3 = std::operator<<(poVar3,local_368);
      poVar3 = std::operator<<(poVar3," != ");
      peVar4 = std::__shared_ptr_access<SchemeObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<SchemeObject,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&actual_result.
                              super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
      (*peVar4->_vptr_SchemeObject[2])(local_388);
      poVar3 = std::operator<<(poVar3,local_388);
      poVar3 = std::operator<<(poVar3," ]]");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_388);
      std::__cxx11::string::~string(local_368);
      exit(1);
    }
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"OK");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::shared_ptr<SchemeObject>::~shared_ptr((shared_ptr<SchemeObject> *)local_348);
  std::shared_ptr<SchemeObject>::~shared_ptr
            ((shared_ptr<SchemeObject> *)
             &actual_result.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::__cxx11::istringstream::~istringstream(local_318);
  std::__cxx11::istringstream::~istringstream(local_198);
  return;
}

Assistant:

static void run_test(const std::string &expression, const std::string &expected_value)
{
    static int test_num = 0;
    ++test_num;
    std::cout << "Test " << test_num << ": ";
    init_scheme();
    std::istringstream in1, in2;
    auto expected_result = evaluate_string_in_global_context(expected_value);
    auto actual_result = evaluate_string_in_global_context(expression);
    if(expected_result != actual_result && !expected_result->is_eq(actual_result))
    {
        std::cout << "FAILED\n" << expression << " != " << expected_value << " [[ " << actual_result->external_repr()
                  << " != " << expected_result->external_repr() << " ]]" << std::endl;
        exit(1);
    }
    std::cout << "OK" << std::endl;
}